

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  bool bVar1;
  pointer pvVar2;
  size_t sVar3;
  pointer pcVar4;
  cmLocalGenerator *pcVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  bool bVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  string_view str;
  string_view str_00;
  string arg;
  string local_70;
  uint local_4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulator;
  
  uVar10 = (ulong)c;
  pvVar2 = (this->EmulatorsWithArguments).
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->EmulatorsWithArguments).
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
           -0x5555555555555555;
  local_4c = c;
  if (uVar11 < uVar10 || uVar11 - uVar10 == 0) {
    emulator.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    emulator.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    emulator.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&emulator,pvVar2 + uVar10);
    if (emulator.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        emulator.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (0x20 < (ulong)((long)emulator.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)emulator.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        uVar11 = 1;
        uVar12 = 2;
        do {
          std::__cxx11::string::append((char *)cmd);
          if (this->OldStyle == true) {
            escapeForShellOldStyle
                      (&arg,(string *)
                            emulator.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
            std::__cxx11::string::_M_append((char *)cmd,(ulong)arg._M_dataplus._M_p);
          }
          else {
            pcVar5 = this->LG;
            pcVar9 = emulator.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p;
            sVar3 = emulator.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length;
            bVar1 = this->MakeVars;
            if (bVar1 == true) {
              bVar8 = cmLocalGenerator::IsNinjaMulti(pcVar5);
            }
            else {
              bVar8 = false;
            }
            str._M_str = pcVar9;
            str._M_len = sVar3;
            cmOutputConverter::EscapeForShell_abi_cxx11_
                      (&arg,&pcVar5->super_cmOutputConverter,str,bVar1,false,false,bVar8,false);
            std::__cxx11::string::_M_append((char *)cmd,(ulong)arg._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)arg._M_dataplus._M_p != &arg.field_2) {
            operator_delete(arg._M_dataplus._M_p,
                            CONCAT71(arg.field_2._M_allocated_capacity._1_7_,
                                     arg.field_2._M_local_buf[0]) + 1);
          }
          uVar11 = (ulong)uVar12;
          uVar12 = uVar12 + 1;
        } while (uVar11 < (ulong)((long)emulator.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)emulator.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      uVar12 = 0;
      goto LAB_00440323;
    }
  }
  uVar12 = 1;
LAB_00440323:
  pcVar4 = (this->CommandLines).
           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar12 <
      (ulong)((long)*(pointer *)
                     ((long)&pcVar4[uVar10].
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 8) -
              *(long *)&pcVar4[uVar10].
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             >> 5)) {
    do {
      uVar12 = uVar12 + 1;
      arg._M_dataplus._M_p = (pointer)&arg.field_2;
      arg._M_string_length = 0;
      arg.field_2._M_local_buf[0] = '\0';
      if (uVar12 == 1) {
        pcVar9 = GetArgv0Location(this,local_4c);
        sVar7 = arg._M_string_length;
        if (pcVar9 == (char *)0x0) goto LAB_004403a2;
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)&arg,0,(char *)sVar7,(ulong)pcVar9);
      }
      else {
LAB_004403a2:
        std::__cxx11::string::_M_assign((string *)&arg);
      }
      std::__cxx11::string::append((char *)cmd);
      sVar7 = arg._M_string_length;
      _Var6 = arg._M_dataplus;
      if (this->OldStyle == true) {
        escapeForShellOldStyle(&local_70,(string *)arg._M_dataplus._M_p);
        std::__cxx11::string::_M_append((char *)cmd,(ulong)local_70._M_dataplus._M_p);
      }
      else {
        pcVar5 = this->LG;
        bVar1 = this->MakeVars;
        if (bVar1 == true) {
          bVar8 = cmLocalGenerator::IsNinjaMulti(pcVar5);
        }
        else {
          bVar8 = false;
        }
        str_00._M_str = _Var6._M_p;
        str_00._M_len = sVar7;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&local_70,&pcVar5->super_cmOutputConverter,str_00,bVar1,false,false,bVar8,false);
        std::__cxx11::string::_M_append((char *)cmd,(ulong)local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg._M_dataplus._M_p != &arg.field_2) {
        operator_delete(arg._M_dataplus._M_p,
                        CONCAT71(arg.field_2._M_allocated_capacity._1_7_,arg.field_2._M_local_buf[0]
                                ) + 1);
      }
    } while ((ulong)uVar12 <
             (ulong)((long)*(pointer *)
                            ((long)&pcVar4[uVar10].
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 8) -
                     *(long *)&pcVar4[uVar10].
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&emulator);
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  std::vector<std::string> emulator = this->GetCrossCompilingEmulator(c);
  if (!emulator.empty()) {
    for (unsigned j = 1; j < emulator.size(); ++j) {
      cmd += " ";
      if (this->OldStyle) {
        cmd += escapeForShellOldStyle(emulator[j]);
      } else {
        cmd +=
          this->LG->EscapeForShell(emulator[j], this->MakeVars, false, false,
                                   this->MakeVars && this->LG->IsNinjaMulti());
      }
    }

    offset = 0;
  }

  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location = j == 0 ? this->GetArgv0Location(c) : nullptr) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmd +=
        this->LG->EscapeForShell(arg, this->MakeVars, false, false,
                                 this->MakeVars && this->LG->IsNinjaMulti());
    }
  }
}